

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsoleTable.cpp
# Opt level: O0

void __thiscall ConsoleTable::updateHeader(ConsoleTable *this,uint header,string *text)

{
  size_type sVar1;
  out_of_range *this_00;
  reference this_01;
  string *text_local;
  uint header_local;
  ConsoleTable *this_local;
  
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->headers);
  if (sVar1 < header) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"Header index out of range.");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  this_01 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&this->headers,(ulong)header);
  std::__cxx11::string::operator=((string *)this_01,(string *)text);
  return;
}

Assistant:

void ConsoleTable::updateHeader(unsigned int header, std::string text) {
    if (header > headers.size())
        throw std::out_of_range{"Header index out of range."};

    headers[header] = text;
}